

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_visitor.h
# Opt level: O0

void __thiscall iqxmlrpc::Print_value_visitor::~Print_value_visitor(Print_value_visitor *this)

{
  Print_value_visitor *this_local;
  
  ~Print_value_visitor(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

class LIBIQXMLRPC_API Print_value_visitor: public Value_type_visitor {
public:
  Print_value_visitor(std::ostream&);

private:
  virtual void do_visit_value(const Value_type&);
  virtual void do_visit_nil();
  virtual void do_visit_int(int);
  virtual void do_visit_int64(int64_t);
  virtual void do_visit_double(double);
  virtual void do_visit_bool(bool);
  virtual void do_visit_string(const std::string&);
  virtual void do_visit_struct(const Struct&);
  virtual void do_visit_array(const Array&);
  virtual void do_visit_base64(const Binary_data&);
  virtual void do_visit_datetime(const Date_time&);

  std::ostream& out_;
}